

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O0

void t3cbf(int gpio,int level,uint32_t tick,void *userdata)

{
  uint *in_RCX;
  uint32_t in_EDX;
  int in_ESI;
  int *val;
  uint32_t td;
  
  if (*in_RCX != 0x1167535) {
    if (t3cbf::unreported != 0) {
      fprintf(_stderr,"unexpected userdata %d (expected %d)\n",(ulong)*in_RCX,0x1167535);
    }
    t3cbf::unreported = 0;
  }
  if (t3_reset == 0) {
    if (in_ESI == 0) {
      t3_on = (float)(in_EDX - t3_tick) + t3_on;
    }
    else {
      t3_off = (float)(in_EDX - t3_tick) + t3_off;
    }
  }
  else {
    t3_count = 0;
    t3_on = 0.0;
    t3_off = 0.0;
    t3_reset = 0;
  }
  t3_count = t3_count + 1;
  t3_tick = in_EDX;
  return;
}

Assistant:

void t3cbf(int gpio, int level, uint32_t tick, void *userdata)
{
   static int unreported = 1;

   uint32_t td;
   int *val;

   val = userdata;

   if (*val != USERDATA)
   {
      if (unreported)
      {
         fprintf
         (
            stderr,
            "unexpected userdata %d (expected %d)\n",
            *val, USERDATA
         );
      }
      unreported = 0;
   }

   if (t3_reset)
   {
      t3_count = 0;
      t3_on = 0.0;
      t3_off = 0.0;
      t3_reset = 0;
   }
   else
   {
      td = tick - t3_tick;

      if (level == 0) t3_on += td;
      else            t3_off += td;
   }

   t3_count ++;
   t3_tick = tick;
}